

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall
kratos::Simulator::set_value_(Simulator *this,Var *var,optional<unsigned_long> op_value)

{
  type_conflict1 tVar1;
  type_conflict1 tVar2;
  ulong *puVar3;
  ulong uVar4;
  initializer_list<unsigned_long_*> __l;
  initializer_list<unsigned_long> __l_00;
  unsigned_long uVar5;
  bool bVar6;
  VarType VVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  unsigned_long *puVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar13;
  size_type sVar14;
  const_reference pvVar15;
  UserException *pUVar16;
  mapped_type *pmVar17;
  reference puVar18;
  reference pvVar19;
  mapped_type *this_00;
  InternalException *pIVar20;
  reference ppuVar21;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  char (*format_str) [34];
  char (*format_str_00) [34];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar22;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar23;
  string_view format_str_01;
  string_view format_str_02;
  format_args args_00;
  format_args args_01;
  uint local_44c;
  _Node_iterator_base<unsigned_int,_false> _Stack_448;
  uint32_t i_2;
  undefined1 local_440;
  uint local_434;
  ulong uStack_430;
  uint32_t bit_1;
  uint64_t m_1;
  mapped_type temp_1;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false> local_418;
  undefined1 local_410 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  changed_bits_1;
  uint local_3c4;
  ulong uStack_3c0;
  uint32_t bit;
  uint64_t m;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  changed_bits;
  uint64_t mask;
  unsigned_long temp;
  unsigned_long *v;
  uint base;
  uint *local_340;
  type_conflict1 *var_low;
  type_conflict1 *var_high;
  undefined1 local_322;
  allocator<char> local_321;
  string local_320;
  undefined1 local_300 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  ulong local_2e0;
  uint64_t i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *v_ref;
  ulong local_2c0;
  uint64_t i;
  undefined1 local_2b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v_1;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_290;
  uint local_284;
  const_iterator cStack_280;
  uint32_t s;
  const_iterator __end5;
  const_iterator __begin5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range5;
  mapped_type *pmStack_260;
  uint32_t base_1;
  iterator local_258;
  undefined8 local_250;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false> local_248;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false> local_240;
  undefined1 local_231;
  v7 local_230 [32];
  string local_210;
  undefined1 local_1f0 [8];
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> values;
  Var *root;
  v7 local_1c8 [32];
  string local_1a8;
  allocator<unsigned_long> local_171;
  unsigned_long local_170;
  iterator local_168;
  size_type local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_140;
  unsigned_long local_120;
  unsigned_long value;
  Var *var_local;
  Simulator *this_local;
  optional<unsigned_long> op_value_local;
  unsigned_long_long local_f0;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_b8;
  string *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_68;
  string *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  bool *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  bool *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  args = op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._8_8_;
  this_local = op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
  op_value_local.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  value = (unsigned_long)var;
  var_local = (Var *)this;
  bVar6 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (!bVar6) {
    return;
  }
  puVar12 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&this_local);
  local_120 = *puVar12;
  pvVar13 = Var::size((Var *)value);
  sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar13);
  if (sVar14 != 1) {
LAB_00384d98:
    uVar5 = value;
    local_170 = local_120;
    local_168 = &local_170;
    local_160 = 1;
    std::allocator<unsigned_long>::allocator(&local_171);
    __l_00._M_len = local_160;
    __l_00._M_array = local_168;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_158,__l_00,&local_171)
    ;
    std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
    optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
              (&local_140,&local_158);
    set_complex_value_(this,(Var *)uVar5,&local_140);
    std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
              (&local_140);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_158);
    std::allocator<unsigned_long>::~allocator(&local_171);
    return;
  }
  pvVar13 = Var::size((Var *)value);
  pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar13);
  if (*pvVar15 != 1) goto LAB_00384d98;
  VVar7 = Var::type((Var *)value);
  if ((VVar7 == Parameter) || (VVar7 = Var::type((Var *)value), VVar7 == ConstValue)) {
    pUVar16 = (UserException *)__cxa_allocate_exception(0x10);
    (**(code **)(*(long *)value + 0x100))(local_1c8);
    local_60 = &local_1a8;
    local_68 = "Cannot set value for constant {0}";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_1c8;
    local_88.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string,char[34],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"Cannot set value for constant {0}",(v7 *)vargs,format_str,args);
    local_78 = &local_88;
    local_98 = fmt::v7::to_string_view<char,_0>(local_68);
    local_50 = &local_a8;
    local_58 = local_78;
    local_28 = local_78;
    local_18 = local_78;
    local_20 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_78->string);
    format_str_01.size_ = local_a8.desc_;
    format_str_01.data_ = (char *)local_98.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_1a8,(detail *)local_98.data_,format_str_01,args_00);
    UserException::UserException(pUVar16,&local_1a8);
    __cxa_throw(pUVar16,&UserException::typeinfo,UserException::~UserException);
  }
  VVar7 = Var::type((Var *)value);
  if (VVar7 != Slice) {
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_410);
    local_418._M_cur =
         (__node_type *)
         std::
         unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
         ::find(&this->values_,(key_type *)&value);
    temp_1 = (mapped_type)
             std::
             unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
             ::end(&this->values_);
    bVar6 = std::__detail::operator!=
                      (&local_418,
                       (_Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>
                        *)&temp_1);
    uVar5 = local_120;
    if (bVar6) {
      pmVar17 = std::
                unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
                ::at(&this->values_,(key_type *)&value);
      uVar5 = local_120;
      m_1 = *pmVar17;
      if (m_1 != local_120) {
        pmVar17 = std::
                  unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
                  ::operator[](&this->values_,(key_type *)&value);
        *pmVar17 = uVar5;
        uStack_430 = local_120 ^ m_1;
        for (local_434 = 0; uVar8 = local_434, uVar11 = (**(code **)(*(long *)value + 0x38))(),
            uVar8 < uVar11; local_434 = local_434 + 1) {
          if ((uStack_430 >> ((byte)local_434 & 0x3f) & 1) != 0) {
            pVar23 = std::
                     unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                     ::emplace<unsigned_int&>
                               ((unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                                 *)local_410,&local_434);
            _Stack_448._M_cur =
                 (__node_type *)pVar23.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
            local_440 = pVar23.second;
          }
        }
      }
    }
    else {
      pmVar17 = std::
                unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
                ::operator[](&this->values_,(key_type *)&value);
      *pmVar17 = uVar5;
      for (local_44c = 0; uVar8 = local_44c, uVar11 = (**(code **)(*(long *)value + 0x38))(),
          uVar8 < uVar11; local_44c = local_44c + 1) {
        std::
        unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
        ::emplace<unsigned_int&>
                  ((unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                    *)local_410,&local_44c);
      }
    }
    trigger_event(this,(Var *)value,
                  (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_410);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_410);
    return;
  }
  values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(**(code **)(*(long *)value + 0x140))();
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::vector
            ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)local_1f0);
  VVar7 = Var::type((Var *)values.
                           super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((VVar7 == ConstValue) ||
     (VVar7 = Var::type((Var *)values.
                               super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
     VVar7 == Parameter)) {
    local_231 = 1;
    pUVar16 = (UserException *)__cxa_allocate_exception(0x10);
    (**(code **)(*(long *)value + 0x100))(local_230);
    local_b0 = &local_210;
    local_b8 = "Cannot set value for constant {0}";
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_230;
    local_d8.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string,char[34],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"Cannot set value for constant {0}",(v7 *)vargs_1,format_str_00,args);
    local_c8 = &local_d8;
    bVar22 = fmt::v7::to_string_view<char,_0>(local_b8);
    format_str_02.data_ = (char *)bVar22.size_;
    local_40 = &op_value_local.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged;
    local_48 = local_c8;
    local_38 = local_c8;
    local_10 = local_c8;
    local_30 = local_40;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_40,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_c8->string);
    format_str_02.size_ =
         op_value_local.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._8_8_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = local_f0;
    fmt::v7::detail::vformat_abi_cxx11_(&local_210,(detail *)bVar22.data_,format_str_02,args_01);
    UserException::UserException(pUVar16,&local_210);
    local_231 = 0;
    __cxa_throw(pUVar16,&UserException::typeinfo,UserException::~UserException);
  }
  pvVar13 = Var::size((Var *)values.
                             super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar13);
  if (sVar14 == 1) {
    pvVar13 = Var::size((Var *)values.
                               super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar13);
    if (*pvVar15 == 1) {
      local_240._M_cur =
           (__node_type *)
           std::
           unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
           ::find(&this->values_,
                  (key_type *)
                  &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_248._M_cur =
           (__node_type *)
           std::
           unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
           ::end(&this->values_);
      bVar6 = std::__detail::operator==(&local_240,&local_248);
      if (bVar6) {
        pmVar17 = std::
                  unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
                  ::operator[](&this->values_,
                               (key_type *)
                               &values.
                                super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        *pmVar17 = 0;
      }
      pmStack_260 = std::
                    unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
                    ::at(&this->values_,
                         (key_type *)
                         &values.
                          super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_258 = &stack0xfffffffffffffda0;
      local_250 = 1;
      __l._M_len = 1;
      __l._M_array = local_258;
      std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator=
                ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)local_1f0,__l);
      goto LAB_0038574b;
    }
  }
  __range5._4_4_ = 1;
  pvVar13 = Var::size((Var *)values.
                             super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  __end5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar13);
  cStack_280 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar13);
  while (bVar6 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffffd80), bVar6) {
    puVar18 = __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&__end5);
    local_284 = *puVar18;
    __range5._4_4_ = local_284 * __range5._4_4_;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end5);
  }
  local_290._M_cur =
       (__node_type *)
       std::
       unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
       ::find(&this->complex_values_,
              (key_type *)
              &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  v_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::end(&this->complex_values_);
  bVar6 = std::__detail::operator==
                    (&local_290,
                     (_Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                      *)&v_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar6) {
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0,
               (ulong)__range5._4_4_,(allocator<unsigned_long> *)((long)&i + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i + 7));
    for (local_2c0 = 0; local_2c0 < __range5._4_4_; local_2c0 = local_2c0 + 1) {
      pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0,
                           local_2c0);
      *pvVar19 = 0;
    }
    std::
    unordered_map<kratos::Var_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
    ::emplace<kratos::Var_const*&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
              ((unordered_map<kratos::Var_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                *)&this->complex_values_,
               (Var **)&values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
  }
  this_00 = std::
            unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::at(&this->complex_values_,
                 (key_type *)
                 &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
            ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)local_1f0,
             (ulong)__range5._4_4_);
  for (local_2e0 = 0; local_2e0 < __range5._4_4_; local_2e0 = local_2e0 + 1) {
    index.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (this_00,local_2e0);
    std::vector<unsigned_long*,std::allocator<unsigned_long*>>::emplace_back<unsigned_long*>
              ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)local_1f0,
               (unsigned_long **)
               &index.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
LAB_0038574b:
  get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_300,this,(Var *)value);
  bVar6 = std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::empty((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_300);
  if (bVar6) {
    local_322 = 1;
    pIVar20 = (InternalException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"Empty slice",&local_321);
    InternalException::InternalException(pIVar20,&local_320);
    local_322 = 0;
    __cxa_throw(pIVar20,&InternalException::typeinfo,InternalException::~InternalException);
  }
  register0x00000000 =
       compute_var_high_low
                 ((Var *)values.
                         super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_300);
  var_low = std::get<0ul,unsigned_int,unsigned_int>
                      ((pair<unsigned_int,_unsigned_int> *)((long)&var_high + 4));
  local_340 = std::get<1ul,unsigned_int,unsigned_int>
                        ((pair<unsigned_int,_unsigned_int> *)((long)&var_high + 4));
  tVar1 = *var_low;
  tVar2 = *local_340;
  uVar8 = (*(code *)(*values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)[7])();
  if ((tVar1 - tVar2) + 1 <= uVar8) {
    uVar8 = *local_340;
    uVar9 = Var::var_width((Var *)values.
                                  super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tVar1 = *var_low;
    v._0_4_ = uVar8 / uVar9;
    uVar10 = Var::var_width((Var *)values.
                                   super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar11 = (uint)v;
    *var_low = tVar1 - (uVar8 / uVar9) * uVar10;
    uVar8 = *local_340;
    uVar9 = Var::var_width((Var *)values.
                                  super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *local_340 = uVar8 - uVar11 * uVar9;
    ppuVar21 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator[]
                         ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)local_1f0,
                          (ulong)(uint)v);
    puVar3 = *ppuVar21;
    uVar4 = *puVar3;
    changed_bits._M_h._M_single_bucket =
         (__node_base_ptr)
         ((0xffffffffffffffffU >> ((char)*var_low + 1U & 0x3f)) >> ((byte)*local_340 & 0x3f));
    *puVar3 = *puVar3 & ((ulong)changed_bits._M_h._M_single_bucket ^ 0xffffffffffffffff);
    local_120 = local_120 & 0xffffffffffffffffU >> (((char)*var_low - (char)*local_340) + 1U & 0x3f)
    ;
    *puVar3 = *puVar3 | local_120 << ((byte)*local_340 & 0x3f);
    if (*puVar3 != uVar4) {
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&m);
      uStack_3c0 = *puVar3 ^ uVar4;
      for (local_3c4 = 0; uVar8 = local_3c4,
          uVar11 = (*(code *)(*values.
                               super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)[7])(),
          uVar8 < uVar11; local_3c4 = local_3c4 + 1) {
        if ((uStack_3c0 >> ((byte)local_3c4 & 0x3f) & 1) != 0) {
          pVar23 = std::
                   unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                   ::emplace<unsigned_int&>
                             ((unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                               *)&m,&local_3c4);
          changed_bits_1._M_h._M_single_bucket =
               (__node_base_ptr)pVar23.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        }
      }
      trigger_event(this,(Var *)values.
                                super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&m);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&m);
    }
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)local_300);
    std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~vector
              ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)local_1f0);
    return;
  }
  v._6_1_ = 1;
  pIVar20 = (InternalException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&base,"Unable to resolve variable slicing",(allocator<char> *)((long)&v + 7))
  ;
  InternalException::InternalException(pIVar20,(string *)&base);
  v._6_1_ = 0;
  __cxa_throw(pIVar20,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void Simulator::set_value_(const kratos::Var *var, std::optional<uint64_t> op_value) {
    if (!op_value) return;
    auto value = *op_value;
    if (var->size().size() != 1 || var->size().front() != 1) {
        set_complex_value_(var, std::vector<uint64_t>{value});
        return;
    }
    if (var->type() == VarType::Parameter || var->type() == VarType::ConstValue) {
        throw UserException(::format("Cannot set value for constant {0}", var->handle_name()));
    } else if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        std::vector<uint64_t *> values;
        if (root->type() == VarType::ConstValue || root->type() == VarType::Parameter) {
            throw UserException(::format("Cannot set value for constant {0}", var->handle_name()));
        } else if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            if (values_.find(root) == values_.end()) values_[root] = 0;
            values = {&values_.at(root)};
        } else {
            uint32_t base = 1;
            for (uint32_t s : root->size()) {
                base *= s;
            }
            if (complex_values_.find(root) == complex_values_.end()) {
                // fill in values
                std::vector<uint64_t> v(base);
                for (uint64_t i = 0; i < base; i++) v[i] = 0;
                complex_values_.emplace(root, v);
            }
            std::vector<uint64_t> &v_ref = complex_values_.at(root);
            values.reserve(base);
            for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
        }
        // obtain the index
        auto index = get_slice_index(var);
        if (index.empty()) throw InternalException("Empty slice");
        auto [var_high, var_low] = compute_var_high_low(root, index);
        if (var_high + 1 - var_low > root->width())
            throw InternalException("Unable to resolve variable slicing");
        auto base = var_low / root->var_width();
        var_high = var_high - base * root->var_width();
        var_low = var_low - base * root->var_width();
        auto *v = values[base];
        auto temp = *v;
        // compute the mask
        uint64_t mask = (0xFFFFFFFFFFFFFFFF >> (var_high + 1)) >> var_low;
        *v = *v & (~mask);
        value = value & (0xFFFFFFFFFFFFFFFF >> (var_high - var_low + 1));
        *v = *v | (value << var_low);
        if (*v != temp) {
            std::unordered_set<uint32_t> changed_bits;
            uint64_t m = (*v) ^ temp;
            for (uint32_t bit = 0; bit < root->width(); bit++) {
                if ((m >> bit) & 1u) {
                    changed_bits.emplace(bit);
                }
            }
            trigger_event(root, changed_bits);
        }
    } else {
        std::unordered_set<uint32_t> changed_bits;
        if (values_.find(var) != values_.end()) {
            auto temp = values_.at(var);
            if (temp != value) {
                values_[var] = value;
                uint64_t m = value ^ temp;
                for (uint32_t bit = 0; bit < var->width(); bit++) {
                    if ((m >> bit) & 1u) {
                        changed_bits.emplace(bit);
                    }
                }
            }
        } else {
            values_[var] = value;
            for (uint32_t i = 0; i < var->width(); i++) changed_bits.emplace(i);
        }
        trigger_event(var, changed_bits);
    }
}